

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleObj(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *origObj)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar4;
  soplex *psVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  soplex local_110 [112];
  int local_a0;
  undefined1 local_9c;
  undefined8 local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_90;
  
  bVar7 = 0;
  uVar1 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).scaleExp.data[i];
  puVar3 = (uint *)origObj;
  psVar5 = local_110;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(uint *)psVar5 = *puVar3;
    puVar3 = puVar3 + 1;
    psVar5 = psVar5 + 4;
  }
  local_a0 = (origObj->m_backend).exp;
  local_9c = (origObj->m_backend).neg;
  local_98._0_4_ = (origObj->m_backend).fpclass;
  local_98._4_4_ = (origObj->m_backend).prec_elem;
  spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&local_90,local_110,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(ulong)uVar1,(undefined4)local_98);
  pnVar4 = &local_90;
  pnVar6 = __return_storage_ptr__;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)((long)pnVar4 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = local_90.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = local_90.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_90.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_90.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::scaleObj(const SPxLPBase<R>& lp, int i, R origObj) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   int exp = colscaleExp[i];

   return spxLdexp(origObj, exp);
}